

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O3

uint32_t BrotliBuildSimpleHuffmanTable
                   (HuffmanCode *table,int root_bits,uint16_t *val,uint32_t num_symbols)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t t;
  long lVar3;
  long lVar4;
  long lVar5;
  uint16_t *puVar6;
  uint32_t uVar7;
  ushort uVar8;
  uint16_t uVar9;
  long lVar10;
  uint16_t t_1;
  ulong uVar11;
  
  uVar11 = 1;
  uVar7 = 1 << ((byte)root_bits & 0x1f);
  switch(num_symbols) {
  case 0:
    table->bits = '\0';
    table->value = *val;
    break;
  case 1:
    table->bits = '\x01';
    table[1].bits = '\x01';
    if (*val < val[1]) {
      table->value = *val;
      uVar9 = val[1];
    }
    else {
      table->value = val[1];
      uVar9 = *val;
    }
    table[1].value = uVar9;
    uVar11 = 2;
    break;
  case 2:
    table->bits = '\x01';
    uVar9 = *val;
    table->value = uVar9;
    table[2].bits = '\x01';
    table[2].value = uVar9;
    uVar1 = val[2];
    uVar2 = val[1];
    uVar8 = uVar2;
    if (uVar1 < uVar2) {
      uVar8 = uVar1;
    }
    puVar6 = val + 1;
    if (uVar2 < uVar1) {
      puVar6 = val + 2;
    }
    table[1].value = uVar8;
    table[3].value = *puVar6;
    table[1].bits = '\x02';
    table[3].bits = '\x02';
    uVar11 = 4;
    break;
  case 3:
    lVar3 = 1;
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      uVar9 = val[lVar4];
      lVar10 = lVar3;
      do {
        uVar1 = val[lVar10];
        if (uVar1 < uVar9) {
          val[lVar10] = uVar9;
          val[lVar4] = uVar1;
          uVar9 = uVar1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      lVar3 = lVar3 + 1;
      lVar4 = lVar5;
    } while (lVar5 != 3);
    lVar4 = 0;
    do {
      table[lVar4].bits = '\x02';
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    table->value = *val;
    table[2].value = val[1];
    table[1].value = val[2];
    table[3].value = val[3];
    uVar11 = 4;
    break;
  case 4:
    uVar1 = val[3];
    if (uVar1 < val[2]) {
      val[3] = val[2];
      val[2] = uVar1;
    }
    uVar9 = *val;
    lVar4 = 0;
    do {
      table[lVar4].value = uVar9;
      table[lVar4].bits = ((byte)lVar4 & 1) + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
    table[1].value = val[1];
    table[3].value = val[2];
    table[5].value = val[1];
    table[7].value = val[3];
    table[3].bits = '\x03';
    table[7].bits = '\x03';
    uVar11 = 8;
  }
  for (; (uint32_t)uVar11 != uVar7; uVar11 = (ulong)((uint32_t)uVar11 * 2)) {
    memcpy(table + uVar11,table,uVar11 << 2);
  }
  return uVar7;
}

Assistant:

uint32_t BrotliBuildSimpleHuffmanTable(HuffmanCode* table,
                                       int root_bits,
                                       uint16_t* val,
                                       uint32_t num_symbols) {
  uint32_t table_size = 1;
  const uint32_t goal_size = 1U << root_bits;
  switch (num_symbols) {
    case 0:
      table[0].bits = 0;
      table[0].value = val[0];
      break;
    case 1:
      table[0].bits = 1;
      table[1].bits = 1;
      if (val[1] > val[0]) {
        table[0].value = val[0];
        table[1].value = val[1];
      } else {
        table[0].value = val[1];
        table[1].value = val[0];
      }
      table_size = 2;
      break;
    case 2:
      table[0].bits = 1;
      table[0].value = val[0];
      table[2].bits = 1;
      table[2].value = val[0];
      if (val[2] > val[1]) {
        table[1].value = val[1];
        table[3].value = val[2];
      } else {
        table[1].value = val[2];
        table[3].value = val[1];
      }
      table[1].bits = 2;
      table[3].bits = 2;
      table_size = 4;
      break;
    case 3: {
      int i, k;
      for (i = 0; i < 3; ++i) {
        for (k = i + 1; k < 4; ++k) {
          if (val[k] < val[i]) {
            uint16_t t = val[k];
            val[k] = val[i];
            val[i] = t;
          }
        }
      }
      for (i = 0; i < 4; ++i) {
        table[i].bits = 2;
      }
      table[0].value = val[0];
      table[2].value = val[1];
      table[1].value = val[2];
      table[3].value = val[3];
      table_size = 4;
      break;
    }
    case 4: {
      int i;
      if (val[3] < val[2]) {
        uint16_t t = val[3];
        val[3] = val[2];
        val[2] = t;
      }
      for (i = 0; i < 7; ++i) {
        table[i].value = val[0];
        table[i].bits = (uint8_t)(1 + (i & 1));
      }
      table[1].value = val[1];
      table[3].value = val[2];
      table[5].value = val[1];
      table[7].value = val[3];
      table[3].bits = 3;
      table[7].bits = 3;
      table_size = 8;
      break;
    }
  }
  while (table_size != goal_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }
  return goal_size;
}